

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.c
# Opt level: O0

int linear_expansion_sum_zeroelim(int elen,float *e,int flen,float *f,float *h)

{
  bool bVar1;
  float fVar2;
  float local_70;
  float local_6c;
  float g0;
  float fnow;
  float enow;
  int count;
  int hindex;
  int findex;
  int eindex;
  float around;
  float bround;
  float avirt;
  float bvirt;
  float R;
  float Qnew;
  float hh;
  float q;
  float Q;
  float *h_local;
  float *f_local;
  int flen_local;
  float *e_local;
  int elen_local;
  
  g0 = *e;
  fVar2 = *f;
  enow = 0.0;
  bVar1 = g0 < fVar2 != -g0 < fVar2;
  if (bVar1) {
    local_6c = f[1];
    local_70 = fVar2;
  }
  else {
    local_70 = g0;
    local_6c = fVar2;
    g0 = e[1];
  }
  hindex = (int)!bVar1;
  count = (int)bVar1;
  if ((hindex < elen) && ((flen <= count || (g0 < local_6c == -g0 < local_6c)))) {
    bvirt = g0 + local_70;
    fVar2 = bvirt - g0;
    hindex = hindex + 1;
    g0 = e[hindex];
  }
  else {
    bvirt = local_6c + local_70;
    fVar2 = bvirt - local_6c;
    count = count + 1;
    local_6c = f[count];
  }
  Qnew = local_70 - fVar2;
  hh = bvirt;
  for (fnow = 2.8026e-45; (int)fnow < elen + flen; fnow = (float)((int)fnow + 1)) {
    if ((hindex < elen) && ((flen <= count || (g0 < local_6c == -g0 < local_6c)))) {
      avirt = g0 + Qnew;
      fVar2 = avirt - g0;
      hindex = hindex + 1;
      g0 = e[hindex];
    }
    else {
      avirt = local_6c + Qnew;
      fVar2 = avirt - local_6c;
      count = count + 1;
      local_6c = f[count];
    }
    R = Qnew - fVar2;
    fVar2 = hh + avirt;
    Qnew = (hh - (fVar2 - (fVar2 - hh))) + (avirt - (fVar2 - hh));
    if ((R != 0.0) || (NAN(R))) {
      h[(int)enow] = R;
      enow = (float)((int)enow + 1);
    }
    hh = fVar2;
  }
  if ((Qnew != 0.0) || (NAN(Qnew))) {
    h[(int)enow] = Qnew;
    enow = (float)((int)enow + 1);
  }
  if (((hh != 0.0) || (NAN(hh))) || (enow == 0.0)) {
    h[(int)enow] = hh;
    enow = (float)((int)enow + 1);
  }
  return (int)enow;
}

Assistant:

int linear_expansion_sum_zeroelim(elen, e, flen, f, h)/* h cannot be e or f. */
int elen;
REAL *e;
int flen;
REAL *f;
REAL *h;
{
  REAL Q, q, hh;
  INEXACT REAL Qnew;
  INEXACT REAL R;
  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  int eindex, findex, hindex;
  int count;
  REAL enow, fnow;
  REAL g0;

  enow = e[0];
  fnow = f[0];
  eindex = findex = 0;
  hindex = 0;
  if ((fnow > enow) == (fnow > -enow)) {
    g0 = enow;
    enow = e[++eindex];
  } else {
    g0 = fnow;
    fnow = f[++findex];
  }
  if ((eindex < elen) && ((findex >= flen)
                          || ((fnow > enow) == (fnow > -enow)))) {
    Fast_Two_Sum(enow, g0, Qnew, q);
    enow = e[++eindex];
  } else {
    Fast_Two_Sum(fnow, g0, Qnew, q);
    fnow = f[++findex];
  }
  Q = Qnew;
  for (count = 2; count < elen + flen; count++) {
    if ((eindex < elen) && ((findex >= flen)
                            || ((fnow > enow) == (fnow > -enow)))) {
      Fast_Two_Sum(enow, q, R, hh);
      enow = e[++eindex];
    } else {
      Fast_Two_Sum(fnow, q, R, hh);
      fnow = f[++findex];
    }
    Two_Sum(Q, R, Qnew, q);
    Q = Qnew;
    if (hh != 0) {
      h[hindex++] = hh;
    }
  }
  if (q != 0) {
    h[hindex++] = q;
  }
  if ((Q != 0.0) || (hindex == 0)) {
    h[hindex++] = Q;
  }
  return hindex;
}